

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::DefineDirectiveSyntax::setChild
          (DefineDirectiveSyntax *this,size_t index,TokenOrSyntax child)

{
  long in_RSI;
  
  (*(code *)(&DAT_00af5870 + *(int *)(&DAT_00af5870 + in_RSI * 4)))();
  return;
}

Assistant:

void DefineDirectiveSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: directive = child.token(); return;
        case 1: name = child.token(); return;
        case 2: formalArguments = child.node() ? &child.node()->as<MacroFormalArgumentListSyntax>() : nullptr; return;
        case 3: body = child.node()->as<TokenList>(); return;
        default: SLANG_UNREACHABLE;
    }
}